

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

void sysbvm_dwarf_debugInfo_attribute_secOffset
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t attribute,uintptr_t value)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    uStack_38._0_3_ =
         CONCAT12((0x7f < attribute) << 7 | (byte)attribute & 0x7f,(undefined2)uStack_38);
    sysbvm_dynarray_add(&builder->abbrev,(void *)((long)&uStack_38 + 2));
    bVar1 = 0x7f < attribute;
    attribute = attribute >> 7;
  } while (bVar1);
  uStack_38._0_4_ = CONCAT13(0x17,(undefined3)uStack_38);
  sysbvm_dynarray_add(&builder->abbrev,(void *)((long)&uStack_38 + 3));
  uStack_38 = CONCAT44((int)value,(undefined4)uStack_38);
  sysbvm_dynarray_addAll(&builder->info,4,(void *)((long)&uStack_38 + 4));
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_secOffset(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t attribute, uintptr_t value)
{
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, attribute);
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, DW_FORM_sec_offset);

    sysbvm_dwarf_encodeDWord(&builder->info, (uint32_t)value);
}